

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                 (RepeatedField<unsigned_long> *value,size_t tag_size,CachedSize *cached_size)

{
  bool bVar1;
  int iVar2;
  const_reference puVar3;
  size_t sVar4;
  size_t res;
  CachedSize *cached_size_local;
  size_t tag_size_local;
  RepeatedField<unsigned_long> *value_local;
  undefined4 local_20;
  int i;
  int n;
  size_t out;
  
  bVar1 = RepeatedField<unsigned_long>::empty(value);
  if (bVar1) {
    CachedSize::Set(cached_size,0);
    value_local = (RepeatedField<unsigned_long> *)0x0;
  }
  else {
    _i = 0;
    iVar2 = RepeatedField<unsigned_long>::size(value);
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      puVar3 = RepeatedField<unsigned_long>::Get(value,local_20);
      sVar4 = UInt64Size(*puVar3);
      _i = sVar4 + _i;
    }
    iVar2 = ToCachedSize(_i);
    CachedSize::SetNonZero(cached_size,iVar2);
    sVar4 = Int32Size((int32_t)_i);
    value_local = (RepeatedField<unsigned_long> *)(tag_size + _i + sVar4);
  }
  return (size_t)value_local;
}

Assistant:

size_t WireFormatLite::UInt64SizeWithPackedTagSize(
    const RepeatedField<uint64_t>& value, size_t tag_size,
    const internal::CachedSize& cached_size) {
  if (value.empty()) {
    cached_size.Set(0);
    return 0;
  }
  size_t res;
  PROTOBUF_ALWAYS_INLINE_CALL res = UInt64Size(value);
  cached_size.SetNonZero(ToCachedSize(res));
  return tag_size + res + Int32Size(static_cast<int32_t>(res));
}